

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.h
# Opt level: O2

void __thiscall UnifiedRegex::Node::Node(Node *this,NodeTag tag)

{
  this->_vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_013df5e8;
  this->tag = tag;
  this->features = 0;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffff8000;
  this->firstSet = (CharSet<char16_t> *)0x0;
  this->followSet = (CharSet<char16_t> *)0x0;
  (this->prevConsumes).lower = 0;
  *(undefined8 *)&(this->prevConsumes).upper = 0xffffffff;
  *(undefined8 *)&(this->thisConsumes).upper = 0xffffffff;
  (this->followConsumes).upper = 0xffffffff;
  return;
}

Assistant:

inline Node(NodeTag tag)
            : tag(tag)
            , features(0)
            , firstSet(0)
            , isFirstExact(false)
            , followSet(0)
            , isThisIrrefutable(false)
            , isFollowIrrefutable(false)
            , isWord(false)
            , isThisWillNotProgress(false)
            , isThisWillNotRegress(false)
            , isPrevWillNotProgress(false)
            , isPrevWillNotRegress(false)
            , isFollowEOL(false)
            , isDeterministic(false)
            , isNotInLoop(false)
            , isAtLeastOnce(false)
            , isNotSpeculative(false)
            , isNotNegated(false)
            , hasInitialHardFailBOI(false)
        {
        }